

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internal iVar2;
  Arena *pAVar3;
  Cord *output;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  char *pcVar4;
  pointer *__ptr_4;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_318;
  internal local_310 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  AssertHelper local_300;
  string local_2f8;
  undefined1 local_2d8 [528];
  ArenaStringPtr local_c8;
  ArenaStringPtr local_c0 [7];
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined8 local_44;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2d8,(Arena *)0x0);
  output = &(this->super_NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>).value_;
  iVar2 = (internal)MessageLite::SerializeToString((MessageLite *)local_2d8,output);
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_310[0] = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,local_310,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,local_2f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
    if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,local_308);
    }
    if (!(bool)iVar2) goto LAB_008ccebf;
  }
  local_300.data_._0_4_ = 0;
  absl::lts_20250127::Cord::operator_cast_to_string(&local_2f8,output);
  local_318._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_2f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_310,"0","this->GetOutput().size()",(int *)&local_300,(unsigned_long *)&local_318)
  ;
  paVar1 = &local_2f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_308 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_308->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x455,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
    }
  }
  if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,local_308);
  }
  local_c0[6].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x0;
  _uStack_88 = 0;
  local_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0.0;
  local_48 = false;
  local_2d8._16_4_ = local_2d8._16_4_ | 0x1fff01;
  pAVar3 = (Arena *)local_2d8._8_8_;
  if ((local_2d8._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_2d8._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_2d8 + 0x208),(string_view)(ZEXT816(0x1141ae9) << 0x40),pAVar3)
  ;
  local_2d8._16_4_ = local_2d8._16_4_ | 2;
  pAVar3 = (Arena *)local_2d8._8_8_;
  if ((local_2d8._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_2d8._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set
            (&local_c8,(string_view)(ZEXT816(0x1141ae9) << 0x40),pAVar3);
  local_44 = 0;
  local_2d8._16_4_ = local_2d8._16_4_ | 0x600004;
  if ((local_2d8._8_8_ & 1) != 0) {
    local_2d8._8_8_ = *(undefined8 *)(local_2d8._8_8_ & 0xfffffffffffffffe);
  }
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  protobuf::internal::ArenaStringPtr::Set
            (local_c0,(string_view)(ZEXT816(0x1141ae9) << 0x40),(Arena *)local_2d8._8_8_);
  iVar2 = (internal)MessageLite::SerializeToString((MessageLite *)local_2d8,output);
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_310[0] = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,local_310,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46b,local_2f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
    if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,local_308);
    }
    if (!(bool)iVar2) goto LAB_008ccebf;
  }
  local_300.data_._0_4_ = 0;
  absl::lts_20250127::Cord::operator_cast_to_string(&local_2f8,output);
  local_318._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_2f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_310,"0","this->GetOutput().size()",(int *)&local_300,(unsigned_long *)&local_318)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_308->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
    }
  }
  if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,local_308);
  }
  uStack_88 = 1;
  local_2d8._16_4_ = local_2d8._16_4_ | 0x200;
  iVar2 = (internal)MessageLite::SerializeToString((MessageLite *)local_2d8,output);
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_310[0] = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,local_310,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x46f,local_2f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
    if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,local_308);
    }
    if (!(bool)iVar2) goto LAB_008ccebf;
  }
  local_300.data_._0_4_ = 2;
  absl::lts_20250127::Cord::operator_cast_to_string(&local_2f8,output);
  local_318._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_2f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_310,"2","this->GetOutput().size()",(int *)&local_300,(unsigned_long *)&local_318)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_308 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_308->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x470,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
    }
  }
  if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,local_308);
  }
  absl::lts_20250127::Cord::operator_cast_to_string(&local_2f8,output);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_310,"\"\\x08\\x01\"","this->GetOutput()",(char (*) [3])0x117fcea,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_308 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_308->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x471,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
    }
  }
  if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,local_308);
  }
  _uStack_88 = _uStack_88 & 0xffffffff00000000;
  local_2d8._16_4_ = local_2d8._16_4_ | 0x200;
  iVar2 = (internal)MessageLite::SerializeToString((MessageLite *)local_2d8,output);
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_310[0] = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,local_310,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x474,local_2f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
    if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,local_308);
    }
    if (!(bool)iVar2) goto LAB_008ccebf;
  }
  local_300.data_._0_4_ = 0;
  absl::lts_20250127::Cord::operator_cast_to_string(&local_2f8,output);
  local_318._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_2f8._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_310,"0","this->GetOutput().size()",(int *)&local_300,(unsigned_long *)&local_318)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_308 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_308->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x475,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
    }
  }
  if (local_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,local_308);
  }
LAB_008ccebf:
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2d8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}